

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.h
# Opt level: O0

void __thiscall
rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::MemoryPoolAllocator
          (MemoryPoolAllocator<rapidjson::CrtAllocator> *this,size_t chunkSize,
          CrtAllocator *baseAllocator)

{
  ChunkHeader *pCVar1;
  SharedData *local_58;
  CrtAllocator *local_48;
  CrtAllocator *baseAllocator_local;
  size_t chunkSize_local;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *this_local;
  
  this->chunk_capacity_ = chunkSize;
  local_48 = baseAllocator;
  if (baseAllocator == (CrtAllocator *)0x0) {
    local_48 = (CrtAllocator *)operator_new(1);
  }
  this->baseAllocator_ = local_48;
  if (this->baseAllocator_ == (CrtAllocator *)0x0) {
    local_58 = (SharedData *)0x0;
  }
  else {
    local_58 = (SharedData *)CrtAllocator::Malloc(this->baseAllocator_,0x38);
  }
  this->shared_ = local_58;
  if (this->baseAllocator_ == (CrtAllocator *)0x0) {
    __assert_fail("baseAllocator_ != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/matusso[P]libssllabs/src/../include/rapidjson/include/rapidjson/allocators.h"
                  ,0xaf,
                  "rapidjson::MemoryPoolAllocator<>::MemoryPoolAllocator(size_t, BaseAllocator *) [BaseAllocator = rapidjson::CrtAllocator]"
                 );
  }
  if (this->shared_ == (SharedData *)0x0) {
    __assert_fail("shared_ != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/matusso[P]libssllabs/src/../include/rapidjson/include/rapidjson/allocators.h"
                  ,0xb0,
                  "rapidjson::MemoryPoolAllocator<>::MemoryPoolAllocator(size_t, BaseAllocator *) [BaseAllocator = rapidjson::CrtAllocator]"
                 );
  }
  if (baseAllocator == (CrtAllocator *)0x0) {
    this->shared_->ownBaseAllocator = this->baseAllocator_;
  }
  else {
    this->shared_->ownBaseAllocator = (CrtAllocator *)0x0;
  }
  pCVar1 = GetChunkHead(this->shared_);
  this->shared_->chunkHead = pCVar1;
  this->shared_->chunkHead->capacity = 0;
  this->shared_->chunkHead->size = 0;
  this->shared_->chunkHead->next = (ChunkHeader *)0x0;
  this->shared_->ownBuffer = true;
  this->shared_->refcount = 1;
  return;
}

Assistant:

explicit
    MemoryPoolAllocator(size_t chunkSize = kDefaultChunkCapacity, BaseAllocator* baseAllocator = 0) : 
        chunk_capacity_(chunkSize),
        baseAllocator_(baseAllocator ? baseAllocator : RAPIDJSON_NEW(BaseAllocator)()),
        shared_(static_cast<SharedData*>(baseAllocator_ ? baseAllocator_->Malloc(SIZEOF_SHARED_DATA + SIZEOF_CHUNK_HEADER) : 0))
    {
        RAPIDJSON_ASSERT(baseAllocator_ != 0);
        RAPIDJSON_ASSERT(shared_ != 0);
        if (baseAllocator) {
            shared_->ownBaseAllocator = 0;
        }
        else {
            shared_->ownBaseAllocator = baseAllocator_;
        }
        shared_->chunkHead = GetChunkHead(shared_);
        shared_->chunkHead->capacity = 0;
        shared_->chunkHead->size = 0;
        shared_->chunkHead->next = 0;
        shared_->ownBuffer = true;
        shared_->refcount = 1;
    }